

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::CustomProfilingSettingsSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  Value *this;
  ClientConfig *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __node_base *p_Var2;
  string profiling_settings_str;
  allocator local_119;
  Value *local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  string local_f0;
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  local_118 = __return_storage_ptr__;
  pCVar1 = ClientConfig::GetConfig(context);
  local_110 = local_100;
  local_108 = 0;
  local_100[0] = 0;
  p_Var2 = &(pCVar1->profiler_settings)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    if (local_108 != 0) {
      ::std::__cxx11::string::append((char *)&local_110);
    }
    ::std::__cxx11::string::string(local_50,"\"%s\": \"true\"",&local_119);
    EnumUtil::ToString<duckdb::MetricsType>(&local_70,(MetricsType)*(size_type *)(p_Var2 + 1));
    StringUtil::Format<std::__cxx11::string>(&local_90,(StringUtil *)local_50,&local_70,in_RCX);
    ::std::__cxx11::string::append((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string(local_50);
  }
  ::std::__cxx11::string::string(local_d0,"{%s}",(allocator *)&local_90);
  ::std::__cxx11::string::string((string *)&local_f0,(string *)&local_110);
  this = local_118;
  StringUtil::Format<std::__cxx11::string>(&local_b0,(StringUtil *)local_d0,&local_f0,in_RCX);
  Value::Value(this,&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string(local_d0);
  ::std::__cxx11::string::~string((string *)&local_110);
  return this;
}

Assistant:

Value CustomProfilingSettingsSetting::GetSetting(const ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);

	string profiling_settings_str;
	for (auto &entry : config.profiler_settings) {
		if (!profiling_settings_str.empty()) {
			profiling_settings_str += ", ";
		}
		profiling_settings_str += StringUtil::Format("\"%s\": \"true\"", EnumUtil::ToString(entry));
	}
	return Value(StringUtil::Format("{%s}", profiling_settings_str));
}